

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pragma.cpp
# Opt level: O1

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformPragma(Transformer *this,PGPragmaStmt *stmt)

{
  Value *pVVar1;
  int iVar2;
  _Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false> _Var3;
  char *pcVar4;
  pointer pcVar5;
  ParserOptions *pPVar6;
  _Head_base<0UL,_duckdb::PragmaStatement_*,_false> _Var7;
  undefined8 uVar8;
  pointer puVar9;
  key_type *args;
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> _Var10;
  bool bVar11;
  PragmaStatement *this_00;
  pointer pPVar12;
  type pPVar13;
  pointer pPVar14;
  BaseExpression *pBVar15;
  ComparisonExpression *pCVar16;
  ColumnRefExpression *pCVar17;
  ConstantExpression *pCVar18;
  string *psVar19;
  ParserOptions *pPVar20;
  InternalException *pIVar21;
  iterator iVar22;
  reference args_1;
  ParserException *pPVar23;
  pointer in_RDX;
  _Alloc_hider _Var24;
  size_type sVar25;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  case_insensitive_set_t sqlite_compat_pragmas;
  templated_unique_single_t result;
  templated_unique_single_t set_statement;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_140;
  undefined1 local_131;
  undefined1 local_130 [8];
  undefined1 local_128 [32];
  __node_base local_108;
  _Head_base<0UL,_duckdb::PragmaStatement_*,_false> local_e8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  *local_e0;
  Value local_d8;
  type local_98;
  pointer local_90;
  key_type *local_88;
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> local_80;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_78;
  undefined1 local_70 [32];
  string local_50;
  
  this_00 = (PragmaStatement *)operator_new(0x80);
  PragmaStatement::PragmaStatement(this_00);
  local_e8._M_head_impl = this_00;
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)this;
  pPVar12 = unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
            ::operator->((unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
                          *)&local_e8);
  pPVar13 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator*
                      (&pPVar12->info);
  _Var3._M_head_impl =
       in_RDX[1].
       super_unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
       .super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>._M_head_impl;
  pcVar4 = (char *)(pPVar13->name)._M_string_length;
  local_90 = in_RDX;
  strlen((char *)_Var3._M_head_impl);
  puVar9 = local_90;
  local_88 = &pPVar13->name;
  ::std::__cxx11::string::_M_replace((ulong)&pPVar13->name,0,pcVar4,(ulong)_Var3._M_head_impl);
  _Var3._M_head_impl =
       puVar9[2].
       super_unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
       .super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>._M_head_impl;
  local_98 = pPVar13;
  if ((_Var3._M_head_impl != (CreatePivotEntry *)0x0) &&
     (sVar25 = ((_Var3._M_head_impl)->enum_name)._M_string_length, sVar25 != 0)) {
    local_e0 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pPVar13->parameters;
    local_78 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&pPVar13->named_parameters;
    pPVar6 = (ParserOptions *)((long)&local_d8 + 0x10);
    do {
      TransformExpression((Transformer *)local_130,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
      pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_130);
      if ((pPVar14->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
        pBVar15 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)local_130)->super_BaseExpression;
        pCVar16 = BaseExpression::Cast<duckdb::ComparisonExpression>(pBVar15);
        pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(&pCVar16->left);
        if ((pPVar14->super_BaseExpression).type != COLUMN_REF) {
          pPVar23 = (ParserException *)__cxa_allocate_exception(0x10);
          local_128._0_8_ = local_128 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_130 + 8),
                     "Named parameter requires a column reference on the LHS","");
          ParserException::ParserException(pPVar23,(string *)(local_130 + 8));
          __cxa_throw(pPVar23,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pBVar15 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(&pCVar16->left)->super_BaseExpression;
        pCVar17 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar15);
        (*(pCVar17->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
                  (&local_d8,pCVar17);
        local_128._0_8_ = local_128 + 0x10;
        if ((ParserOptions *)local_d8.type_._0_8_ == pPVar6) {
          local_128._24_4_ = local_d8._24_4_;
          local_128._28_4_ = local_d8._28_4_;
        }
        else {
          local_128[0] = local_d8.type_.id_;
          local_128[1] = local_d8.type_.physical_type_;
          local_128._2_6_ = local_d8.type_._2_6_;
        }
        local_128._20_4_ =
             local_d8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ._4_4_;
        local_128._16_4_ =
             (uint)local_d8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        local_128._8_8_ =
             local_d8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = (uint)local_d8.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi & 0xffffff00;
        local_108._M_nxt =
             (_Hash_node_base *)
             (pCVar16->right).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pCVar16->right).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)0x0;
        local_d8.type_._0_8_ = pPVar6;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  (local_78,local_130 + 8);
        if ((ParsedExpression *)local_108._M_nxt != (ParsedExpression *)0x0) {
          (*((BaseExpression *)&(local_108._M_nxt)->_M_nxt)->_vptr_BaseExpression[1])();
        }
        local_108._M_nxt = (_Hash_node_base *)0x0;
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_);
        }
        _Var24._M_p = (pointer)local_d8.type_._0_8_;
        if ((ParserOptions *)local_d8.type_._0_8_ != pPVar6) {
LAB_01290ace:
          operator_delete(_Var24._M_p);
        }
      }
      else {
        pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)local_130);
        if ((pPVar14->super_BaseExpression).type == COLUMN_REF) {
          pBVar15 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)local_130)->super_BaseExpression;
          pCVar17 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar15);
          bVar11 = ColumnRefExpression::IsQualified(pCVar17);
          if (bVar11) {
            pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)local_130);
            (*(pPVar14->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar14);
            Value::Value(&local_d8,&local_50);
            pCVar18 = (ConstantExpression *)operator_new(0x78);
            pVVar1 = (Value *)(local_130 + 8);
            Value::Value(pVVar1,&local_d8);
            ConstantExpression::ConstantExpression(pCVar18,pVVar1);
            local_140._M_head_impl = pCVar18;
            Value::~Value(pVVar1);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      (local_e0,(unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                                 *)&local_140);
            if (local_140._M_head_impl != (ConstantExpression *)0x0) {
              (*((local_140._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
            local_140._M_head_impl = (ConstantExpression *)0x0;
            Value::~Value(&local_d8);
            pPVar20 = (ParserOptions *)&local_50.field_2;
            _Var24._M_p = local_50._M_dataplus._M_p;
          }
          else {
            psVar19 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar17);
            local_70._0_8_ = local_70 + 0x10;
            pcVar5 = (psVar19->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar5,pcVar5 + psVar19->_M_string_length);
            Value::Value(&local_d8,(string *)local_70);
            pCVar18 = (ConstantExpression *)operator_new(0x78);
            pVVar1 = (Value *)(local_130 + 8);
            Value::Value(pVVar1,&local_d8);
            ConstantExpression::ConstantExpression(pCVar18,pVVar1);
            local_140._M_head_impl = pCVar18;
            Value::~Value(pVVar1);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      (local_e0,(unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                                 *)&local_140);
            if (local_140._M_head_impl != (ConstantExpression *)0x0) {
              (*((local_140._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
            local_140._M_head_impl = (ConstantExpression *)0x0;
            Value::~Value(&local_d8);
            pPVar20 = (ParserOptions *)(local_70 + 0x10);
            _Var24._M_p = (pointer)local_70._0_8_;
          }
          if ((ParserOptions *)_Var24._M_p != pPVar20) goto LAB_01290ace;
        }
        else {
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    (local_e0,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)local_130);
        }
      }
      if ((long *)CONCAT71(local_130._1_7_,local_130[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_130._1_7_,local_130[0]) + 8))();
      }
      sVar25 = *(size_type *)(sVar25 + 8);
    } while (sVar25 != 0);
  }
  _Var10._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       local_80._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  pPVar13 = local_98;
  iVar2 = *(int *)((long)&(local_90->
                          super_unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                          )._M_t.
                          super___uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                          .super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>.
                          _M_head_impl + 4);
  if (iVar2 != 2) {
    if (iVar2 == 1) {
      if ((long)(local_98->parameters).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_98->parameters).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pPVar23 = (ParserException *)__cxa_allocate_exception(0x10);
        local_128._0_8_ = local_128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_130 + 8),
                   "PRAGMA statement with assignment should contain exactly one parameter","");
        ParserException::ParserException(pPVar23,(string *)(local_130 + 8));
        __cxa_throw(pPVar23,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((local_98->named_parameters)._M_h._M_element_count != 0) {
        pIVar21 = (InternalException *)__cxa_allocate_exception(0x10);
        local_128._0_8_ = local_128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_130 + 8),
                   "PRAGMA statement with assignment cannot have named parameters","");
        InternalException::InternalException(pIVar21,(string *)(local_130 + 8));
        __cxa_throw(pIVar21,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_d8.type_._0_8_ = (ParserOptions *)((long)&local_d8 + 0x10U);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"table_info","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)(local_130 + 8),&local_d8,(long)&local_d8 + 0x20,0,local_130,&local_140,
                 &local_131);
      if ((ParserOptions *)local_d8.type_._0_8_ != (ParserOptions *)((long)&local_d8 + 0x10U)) {
        operator_delete((void *)local_d8.type_._0_8_);
      }
      args = local_88;
      iVar22 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)(local_130 + 8),local_88);
      if (iVar22.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        args_1 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](&pPVar13->parameters,0);
        local_130[0] = AUTOMATIC;
        make_uniq<duckdb::SetVariableStatement,std::__cxx11::string&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::SetScope>
                  ((duckdb *)&local_d8,args,args_1,local_130);
        uVar8 = local_d8.type_._0_8_;
        local_d8.type_._0_8_ = (ParserOptions *)0x0;
        *(undefined8 *)
         _Var10._M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = uVar8;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)(local_130 + 8));
        goto LAB_01290d0d;
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)(local_130 + 8));
    }
    else {
      if (iVar2 != 0) {
        pIVar21 = (InternalException *)__cxa_allocate_exception(0x10);
        local_128._0_8_ = local_128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_130 + 8),"Unknown pragma type","");
        InternalException::InternalException(pIVar21,(string *)(local_130 + 8));
        __cxa_throw(pIVar21,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (((local_98->parameters).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (local_98->parameters).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((local_98->named_parameters)._M_h._M_element_count != 0)) {
        pIVar21 = (InternalException *)__cxa_allocate_exception(0x10);
        local_128._0_8_ = local_128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_130 + 8),
                   "PRAGMA statement that is not a call or assignment cannot contain parameters","")
        ;
        InternalException::InternalException(pIVar21,(string *)(local_130 + 8));
        __cxa_throw(pIVar21,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  _Var7._M_head_impl = local_e8._M_head_impl;
  local_e8._M_head_impl = (PragmaStatement *)0x0;
  *(PragmaStatement **)
   _Var10._M_t.
   super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
   super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = _Var7._M_head_impl;
LAB_01290d0d:
  if (local_e8._M_head_impl != (PragmaStatement *)0x0) {
    (*((local_e8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (_Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
         _Var10._M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformPragma(duckdb_libpgquery::PGPragmaStmt &stmt) {
	auto result = make_uniq<PragmaStatement>();
	auto &info = *result->info;

	info.name = stmt.name;
	// parse the arguments, if any
	if (stmt.args) {
		for (auto cell = stmt.args->head; cell != nullptr; cell = cell->next) {
			auto node = PGPointerCast<duckdb_libpgquery::PGNode>(cell->data.ptr_value);
			auto expr = TransformExpression(node);

			if (expr->GetExpressionType() == ExpressionType::COMPARE_EQUAL) {
				auto &comp = expr->Cast<ComparisonExpression>();
				if (comp.left->GetExpressionType() != ExpressionType::COLUMN_REF) {
					throw ParserException("Named parameter requires a column reference on the LHS");
				}
				auto &columnref = comp.left->Cast<ColumnRefExpression>();
				info.named_parameters.insert(make_pair(columnref.GetName(), std::move(comp.right)));
			} else if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (!colref.IsQualified()) {
					info.parameters.emplace_back(make_uniq<ConstantExpression>(Value(colref.GetColumnName())));
				} else {
					info.parameters.emplace_back(make_uniq<ConstantExpression>(Value(expr->ToString())));
				}
			} else {
				info.parameters.emplace_back(std::move(expr));
			}
		}
	}
	// now parse the pragma type
	switch (stmt.kind) {
	case duckdb_libpgquery::PG_PRAGMA_TYPE_NOTHING: {
		if (!info.parameters.empty() || !info.named_parameters.empty()) {
			throw InternalException("PRAGMA statement that is not a call or assignment cannot contain parameters");
		}
		break;
	case duckdb_libpgquery::PG_PRAGMA_TYPE_ASSIGNMENT:
		if (info.parameters.size() != 1) {
			throw ParserException("PRAGMA statement with assignment should contain exactly one parameter");
		}
		if (!info.named_parameters.empty()) {
			throw InternalException("PRAGMA statement with assignment cannot have named parameters");
		}
		// SQLite does not distinguish between:
		// "PRAGMA table_info='integers'"
		// "PRAGMA table_info('integers')"
		// for compatibility, any pragmas that match the SQLite ones are parsed as calls
		case_insensitive_set_t sqlite_compat_pragmas {"table_info"};
		if (sqlite_compat_pragmas.find(info.name) != sqlite_compat_pragmas.end()) {
			break;
		}
		auto set_statement =
		    make_uniq<SetVariableStatement>(info.name, std::move(info.parameters[0]), SetScope::AUTOMATIC);
		return std::move(set_statement);
	}
	case duckdb_libpgquery::PG_PRAGMA_TYPE_CALL:
		break;
	default:
		throw InternalException("Unknown pragma type");
	}

	return std::move(result);
}